

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  uint uVar1;
  GCstr *pGVar2;
  CPDecl *decl_00;
  CPState *in_RSI;
  CPDecl *in_RDI;
  CPState *unaff_retaddr;
  
LAB_0017b9de:
  decl_00 = (CPDecl *)(ulong)(in_RDI->pos - 0x118);
  switch(decl_00) {
  case (CPDecl *)0x0:
    (in_RSI->sb).e.ptr32 = (in_RSI->sb).e.ptr32 | 0x2000000;
    break;
  case (CPDecl *)0x1:
    (in_RSI->sb).e.ptr32 = (in_RSI->sb).e.ptr32 | 0x1000000;
    break;
  case (CPDecl *)0x2:
    break;
  default:
    return;
  case (CPDecl *)0x9:
    break;
  case (CPDecl *)0xa:
    cp_decl_asm(in_RSI,decl_00);
    goto LAB_0017b9de;
  case (CPDecl *)0xb:
    cp_decl_gccattribute(cp,decl);
    goto LAB_0017b9de;
  case (CPDecl *)0xc:
    goto switchD_0017ba0c_caseD_c;
  case (CPDecl *)0xd:
    break;
  case (CPDecl *)0xe:
    pGVar2 = in_RDI->name;
    uVar1._0_1_ = pGVar2->marked;
    uVar1._1_1_ = pGVar2->gct;
    uVar1._2_1_ = pGVar2->reserved;
    uVar1._3_1_ = pGVar2->strflags;
    (in_RSI->sb).e.ptr32 = (in_RSI->sb).e.ptr32 & 0xffff00ff | (uVar1 & 0xff) << 8;
  }
  cp_next((CPState *)0x17bab0);
  goto LAB_0017b9de;
switchD_0017ba0c_caseD_c:
  cp_decl_msvcattribute(unaff_retaddr,in_RDI);
  goto LAB_0017b9de;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}